

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_linux.cc
# Opt level: O0

vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_> *
rcdiscover::SocketLinux::createAndBindForAllInterfaces(uint16_t port)

{
  undefined1 uVar1;
  long lVar2;
  in_addr_t *piVar3;
  reference pvVar4;
  socklen_t sVar5;
  sockaddr *__addr;
  sockaddr *__addr_00;
  sockaddr *__addr_01;
  undefined2 in_SI;
  vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_> *in_RDI;
  sockaddr_in addr_3;
  sockaddr_in addr_2;
  socklen_t address_length;
  sockaddr_in local_address;
  sockaddr_in addr_1;
  uint16_t local_port;
  in_addr_t s_addr;
  string name;
  sockaddr *baddr;
  ifaddrs *addr;
  int i;
  ifaddrs *addrs;
  vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_> *sockets;
  undefined4 in_stack_fffffffffffffe08;
  undefined2 in_stack_fffffffffffffe0c;
  undefined2 in_stack_fffffffffffffe0e;
  uint32_t in_stack_fffffffffffffe10;
  undefined2 in_stack_fffffffffffffe14;
  undefined2 in_stack_fffffffffffffe16;
  in_addr_t iVar6;
  undefined2 uVar7;
  undefined1 in_stack_fffffffffffffe1e;
  vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_> *this;
  undefined2 in_stack_fffffffffffffe40;
  char in_stack_fffffffffffffe42 [2];
  uint32_t in_stack_fffffffffffffe44;
  char *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe60;
  uint16_t in_stack_fffffffffffffe6a;
  in_addr_t in_stack_fffffffffffffe6c;
  undefined2 local_158;
  char local_156 [2];
  uint32_t local_154;
  string local_148 [92];
  socklen_t local_ec;
  sockaddr local_e8;
  undefined2 local_d8;
  undefined2 local_d6;
  undefined4 local_d4;
  string local_c8 [94];
  char local_6a [2];
  undefined4 local_68;
  allocator<char> local_51;
  string local_50 [32];
  long local_30;
  undefined8 *local_28;
  int local_1c;
  undefined8 *local_18;
  undefined1 local_b;
  undefined2 local_a;
  
  local_b = 0;
  local_a = in_SI;
  std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>::vector
            ((vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_> *)0x12a8c4);
  getifaddrs(&local_18);
  local_1c = 0;
  for (local_28 = local_18; local_28 != (undefined8 *)0x0; local_28 = (undefined8 *)*local_28) {
    local_30 = local_28[5];
    if (((((*(uint *)(local_28 + 2) & 1) != 0) && (local_28[1] != 0)) && (local_28[3] != 0)) &&
       ((*(short *)local_28[3] == 2 && (local_30 != 0)))) {
      this = (vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_> *)
             local_28[1];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                 (allocator<char> *)
                 CONCAT44(in_stack_fffffffffffffe44,
                          CONCAT22(in_stack_fffffffffffffe42,in_stack_fffffffffffffe40)));
      std::allocator<char>::~allocator(&local_51);
      lVar2 = std::__cxx11::string::length();
      if ((lVar2 != 0) &&
         (uVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT26(in_stack_fffffffffffffe16,
                                              CONCAT24(in_stack_fffffffffffffe14,
                                                       in_stack_fffffffffffffe10)),
                                  (char *)CONCAT26(in_stack_fffffffffffffe0e,
                                                   CONCAT24(in_stack_fffffffffffffe0c,
                                                            in_stack_fffffffffffffe08))),
         (bool)uVar1)) {
        local_68 = *(undefined4 *)(local_28[3] + 4);
        local_6a[0] = '\0';
        local_6a[1] = '\0';
        piVar3 = getBroadcastAddr();
        iVar6 = *piVar3;
        uVar7 = local_a;
        std::__cxx11::string::string(local_c8,local_50);
        sVar5 = (socklen_t)local_c8;
        create(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe6a,in_stack_fffffffffffffe60);
        std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>::
        emplace_back<rcdiscover::SocketLinux>
                  (this,(SocketLinux *)
                        CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffe1e,CONCAT24(uVar7,iVar6))));
        ~SocketLinux((SocketLinux *)
                     CONCAT26(in_stack_fffffffffffffe16,
                              CONCAT24(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10)));
        std::__cxx11::string::~string(local_c8);
        local_d8 = 2;
        local_d6 = 0;
        local_d4 = local_68;
        pvVar4 = std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>::
                 back((vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_> *)
                      CONCAT26(in_stack_fffffffffffffe16,
                               CONCAT24(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10)));
        Socket<rcdiscover::SocketLinux>::bind
                  (&pvVar4->super_Socket<rcdiscover::SocketLinux>,(int)&local_d8,__addr,sVar5);
        local_ec = 0x10;
        pvVar4 = std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>::
                 back((vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_> *)
                      CONCAT26(in_stack_fffffffffffffe16,
                               CONCAT24(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10)));
        getsockname(pvVar4->sock_,&local_e8,&local_ec);
        local_6a[0] = local_e8.sa_data[0];
        local_6a[1] = local_e8.sa_data[1];
        in_stack_fffffffffffffe10 = htonl(0);
        in_stack_fffffffffffffe16 = local_a;
        std::__cxx11::string::string(local_148,local_50);
        sVar5 = (socklen_t)local_148;
        create(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe6a,in_stack_fffffffffffffe60);
        std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>::
        emplace_back<rcdiscover::SocketLinux>
                  (this,(SocketLinux *)
                        CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffe1e,CONCAT24(uVar7,iVar6))));
        ~SocketLinux((SocketLinux *)
                     CONCAT26(in_stack_fffffffffffffe16,
                              CONCAT24(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10)));
        std::__cxx11::string::~string(local_148);
        local_158 = 2;
        local_156[0] = local_6a[0];
        local_156[1] = local_6a[1];
        local_154 = htonl(0);
        pvVar4 = std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>::
                 back((vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_> *)
                      CONCAT26(in_stack_fffffffffffffe16,
                               CONCAT24(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10)));
        Socket<rcdiscover::SocketLinux>::bind
                  (&pvVar4->super_Socket<rcdiscover::SocketLinux>,(int)&local_158,__addr_00,sVar5);
        in_stack_fffffffffffffe08 = *(undefined4 *)(local_30 + 4);
        in_stack_fffffffffffffe0e = local_a;
        std::__cxx11::string::string((string *)&stack0xfffffffffffffe50,local_50);
        sVar5 = (socklen_t)&stack0xfffffffffffffe50;
        create(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe6a,in_stack_fffffffffffffe60);
        std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>::
        emplace_back<rcdiscover::SocketLinux>
                  (this,(SocketLinux *)
                        CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffe1e,CONCAT24(uVar7,iVar6))));
        ~SocketLinux((SocketLinux *)
                     CONCAT26(in_stack_fffffffffffffe16,
                              CONCAT24(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10)));
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffe50);
        in_stack_fffffffffffffe40 = 2;
        in_stack_fffffffffffffe42 = local_6a;
        in_stack_fffffffffffffe44 = htonl(0);
        pvVar4 = std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>::
                 back((vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_> *)
                      CONCAT26(in_stack_fffffffffffffe16,
                               CONCAT24(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10)));
        Socket<rcdiscover::SocketLinux>::bind
                  (&pvVar4->super_Socket<rcdiscover::SocketLinux>,(int)&stack0xfffffffffffffe40,
                   __addr_01,sVar5);
      }
      std::__cxx11::string::~string(local_50);
    }
    local_1c = local_1c + 1;
  }
  freeifaddrs(local_18);
  return in_RDI;
}

Assistant:

std::vector<SocketLinux> SocketLinux::createAndBindForAllInterfaces(
    const uint16_t port)
{
  std::vector<SocketLinux> sockets;

  ifaddrs *addrs;
  getifaddrs(&addrs);

  int i = 0;

  for(ifaddrs *addr = addrs;
      addr != nullptr;
      addr = addr->ifa_next)
  {
    auto baddr = addr->ifa_ifu.ifu_broadaddr;
    if (addr->ifa_flags & IFF_UP &&
        addr->ifa_name != nullptr &&
        addr->ifa_addr != nullptr &&
        addr->ifa_addr->sa_family == AF_INET &&
        baddr != nullptr)
    {
      std::string name(addr->ifa_name);
      if (name.length() != 0 && name != "lo")
      {
        const in_addr_t s_addr =
            reinterpret_cast<struct sockaddr_in *>(addr->ifa_addr)->
            sin_addr.s_addr;

        uint16_t local_port = 0;

        {
          // limited broadcast
          sockets.emplace_back(SocketLinux::create(getBroadcastAddr(), port, name));

          sockaddr_in addr;
          addr.sin_family = AF_INET;
          addr.sin_port = 0;
          addr.sin_addr.s_addr = s_addr;
          sockets.back().bind(addr);
        }

        {
          // get port to which the limited broadcast socket is bound to
          struct sockaddr_in local_address;
          socklen_t address_length = sizeof(local_address);
          getsockname(sockets.back().sock_,
                      reinterpret_cast<sockaddr *>(&local_address),
                      &address_length);
          local_port = local_address.sin_port;
        }

        {
          // limited broadcast receiver
          sockets.emplace_back(SocketLinux::create(htonl(INADDR_ANY), port, name));

          sockaddr_in addr;
          addr.sin_family = AF_INET;
          addr.sin_port = local_port;
          addr.sin_addr.s_addr = htonl(INADDR_ANY);
          sockets.back().bind(addr);
        }

        {
          // directed broadcast
          sockets.emplace_back(
                SocketLinux::create(
                  reinterpret_cast<struct sockaddr_in *>(baddr)->
                  sin_addr.s_addr, port, name));
          sockaddr_in addr;
          addr.sin_family = AF_INET;
          addr.sin_port = local_port;
          addr.sin_addr.s_addr = htonl(INADDR_ANY);
          sockets.back().bind(addr);
        }
      }
    }

    ++i;
  }

  freeifaddrs(addrs);
  addrs = nullptr;

  return sockets;
}